

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::BindingModel::anon_unknown_1::BufferRenderInstance::logTestPlan(BufferRenderInstance *this)

{
  ostringstream *this_00;
  ShaderInputInterface SVar1;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  ostringstream msg;
  undefined1 auStack_338 [8];
  long *local_330;
  long local_328;
  long local_320 [2];
  long local_310 [14];
  ios_base local_2a0 [264];
  undefined1 local_198 [384];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"Rendering 2x2 yellow-green grid.\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"Single descriptor set. Descriptor set contains ",0x2f);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    pcVar5 = "single";
  }
  else if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    pcVar5 = "an array (size 2) of";
  }
  else {
    if (SVar1 != SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      std::ios::clear((int)auStack_338 + (int)*(undefined8 *)(local_310[0] + -0x18) + 0x28);
      goto LAB_0051f6d3;
    }
    pcVar5 = "two";
  }
  sVar2 = strlen(pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,pcVar5,sVar2);
LAB_0051f6d3:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310," descriptor(s) of type ",0x17);
  pcVar5 = ::vk::getDescriptorTypeName(this->m_descriptorType);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)auStack_338 + (int)*(undefined8 *)(local_310[0] + -0x18) + 0x28);
  }
  else {
    sVar2 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,pcVar5,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"Buffer view(s) have ",0x14);
  pcVar6 = "non-";
  pcVar5 = "";
  if (this->m_setViewOffset != false) {
    pcVar5 = "non-";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,pcVar5,(ulong)this->m_setViewOffset << 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,"zero offset.\n",0xd);
  if ((this->m_descriptorType & ~VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) ==
      VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC) {
    if (this->m_setDynamicOffset == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_310,"Source buffer(s) are given a dynamic offset at bind time.\n",
                 0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_310,"The supplied dynamic offset is ",0x1f);
      if (this->m_dynamicOffsetNonZero == false) {
        pcVar6 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_310,pcVar6,(ulong)this->m_dynamicOffsetNonZero << 2);
      lVar4 = 6;
      pcVar5 = "zero.\n";
    }
    else {
      lVar4 = 0x49;
      pcVar5 = "Dynamic offset is not supplied at bind time. Expecting bind to offset 0.\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,pcVar5,lVar4);
  }
  if (this->m_stageFlags == 0) {
    lVar4 = 0x32;
    pcVar5 = "Descriptors are not accessed in any shader stage.\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_310,"Descriptors are accessed in {",0x1d);
    bVar7 = (this->m_stageFlags & 1) == 0;
    pcVar5 = " vertex";
    if (bVar7) {
      pcVar5 = "";
    }
    lVar4 = 7;
    if (bVar7) {
      lVar4 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,pcVar5,lVar4);
    bVar7 = (this->m_stageFlags & 2) == 0;
    pcVar5 = " tess_control";
    if (bVar7) {
      pcVar5 = "";
    }
    lVar4 = 0xd;
    if (bVar7) {
      lVar4 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,pcVar5,lVar4);
    uVar3 = this->m_stageFlags & 4;
    pcVar5 = " tess_evaluation";
    if (uVar3 == 0) {
      pcVar5 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_310,pcVar5,(ulong)(uVar3 << 2));
    uVar3 = this->m_stageFlags & 8;
    pcVar5 = " geometry";
    if (uVar3 == 0) {
      pcVar5 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_310,pcVar5,(ulong)(uVar3 >> 3) * 9);
    uVar3 = this->m_stageFlags & 0x10;
    pcVar5 = " fragment";
    if (uVar3 == 0) {
      pcVar5 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_310,pcVar5,(ulong)(uVar3 >> 4) * 9);
    lVar4 = 0xb;
    pcVar5 = " } stages.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_310,pcVar5,lVar4);
  local_198._0_8_ =
       ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.super_TestInstance.
       m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_330,local_328)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
  std::ios_base::~ios_base(local_2a0);
  return;
}

Assistant:

void BufferRenderInstance::logTestPlan (void) const
{
	std::ostringstream msg;

	msg << "Rendering 2x2 yellow-green grid.\n"
		<< "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
		<< " descriptor(s) of type " << vk::getDescriptorTypeName(m_descriptorType) << "\n"
		<< "Buffer view(s) have " << ((m_setViewOffset) ? ("non-") : ("")) << "zero offset.\n";

	if (isDynamicDescriptorType(m_descriptorType))
	{
		if (m_setDynamicOffset)
		{
			msg << "Source buffer(s) are given a dynamic offset at bind time.\n"
				<< "The supplied dynamic offset is " << ((m_dynamicOffsetNonZero) ? ("non-") : ("")) << "zero.\n";
		}
		else
		{
			msg << "Dynamic offset is not supplied at bind time. Expecting bind to offset 0.\n";
		}
	}

	if (m_stageFlags == 0u)
	{
		msg << "Descriptors are not accessed in any shader stage.\n";
	}
	else
	{
		msg << "Descriptors are accessed in {"
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_VERTEX_BIT) != 0)					? (" vertex")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0)	? (" tess_control")		: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0)	? (" tess_evaluation")	: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_GEOMETRY_BIT) != 0)				? (" geometry")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0)				? (" fragment")			: (""))
			<< " } stages.\n";
	}

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< msg.str()
		<< tcu::TestLog::EndMessage;
}